

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O1

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,_1,int> *this,
          InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *other)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long local_18;
  
  local_18 = *(long *)(*(long *)other + 8);
  Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<long>((Matrix<int,__1,_1,_0,__1,_1> *)this,&local_18);
  uVar1 = *(undefined8 *)(this + 8);
  if (0 < (int)(uint)uVar1) {
    lVar2 = **(long **)other;
    lVar3 = *(long *)this;
    uVar4 = 0;
    do {
      *(int *)(lVar3 + (long)*(int *)(lVar2 + uVar4 * 4) * 4) = (int)uVar4;
      uVar4 = uVar4 + 1;
    } while (((uint)uVar1 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

PermutationMatrix(const InverseImpl<Other,PermutationStorage>& other)
      : m_indices(other.derived().nestedExpression().size())
    {
      eigen_internal_assert(m_indices.size() <= NumTraits<StorageIndex>::highest());
      StorageIndex end = StorageIndex(m_indices.size());
      for (StorageIndex i=0; i<end;++i)
        m_indices.coeffRef(other.derived().nestedExpression().indices().coeff(i)) = i;
    }